

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O2

uchar * nvpair_unpack_number_array(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  size_t __size;
  uint uVar1;
  int *piVar2;
  void *pvVar3;
  uint64_t uVar4;
  uint8_t *p;
  ulong uVar5;
  ulong uVar6;
  
  if (nvp->nvp_type != 9) {
    __assert_fail("nvp->nvp_type == 9",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x398,
                  "const unsigned char *nvpair_unpack_number_array(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  uVar5 = nvp->nvp_nitems;
  __size = uVar5 * 8;
  if ((nvp->nvp_datasize == __size) && (uVar6 = *leftp, uVar5 - 1 < __size && __size <= uVar6)) {
    pvVar3 = malloc(__size);
    uVar1 = 0;
    if (pvVar3 != (void *)0x0) {
      while( true ) {
        uVar6 = uVar6 - 8;
        if (uVar5 <= uVar1) break;
        if (isbe) {
          uVar4 = be64dec(ptr);
        }
        else {
          uVar4 = *(uint64_t *)ptr;
        }
        *(uint64_t *)((long)pvVar3 + (ulong)uVar1 * 8) = uVar4;
        ptr = (uchar *)((long)ptr + 8);
        *leftp = uVar6;
        uVar1 = uVar1 + 1;
        uVar5 = nvp->nvp_nitems;
      }
      nvp->nvp_data = (uint64_t)pvVar3;
      return (uchar *)(uint64_t *)ptr;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_number_array(bool isbe, nvpair_t *nvp, const unsigned char *ptr,
     size_t *leftp)
{
	uint64_t *value;
	size_t size;
	unsigned int i;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_NUMBER_ARRAY);

	size = sizeof(*value) * nvp->nvp_nitems;
	if (nvp->nvp_datasize != size || *leftp < size ||
	    nvp->nvp_nitems == 0 || size < nvp->nvp_nitems) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(size);
	if (value == NULL)
		return (NULL);

	for (i = 0; i < nvp->nvp_nitems; i++) {
		if (isbe)
			value[i] = be64dec(ptr);
		else
			value[i] = le64dec(ptr);

		ptr += sizeof(*value);
		*leftp -= sizeof(*value);
	}

	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
}